

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

Vec_Int_t * Vec_IntStartRange(int First,int Range)

{
  Vec_Int_t *pVVar1;
  int local_1c;
  int i;
  Vec_Int_t *p;
  int Range_local;
  int First_local;
  
  pVVar1 = Vec_IntAlloc(Range);
  pVVar1->nSize = Range;
  for (local_1c = 0; local_1c < Range; local_1c = local_1c + 1) {
    pVVar1->pArray[local_1c] = First + local_1c;
  }
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntStartRange( int First, int Range )
{
    Vec_Int_t * p;
    int i;
    p = Vec_IntAlloc( Range );
    p->nSize = Range;
    for ( i = 0; i < Range; i++ )
        p->pArray[i] = First + i;
    return p;
}